

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_function_proto_caller(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  ulong in_RAX;
  undefined4 in_register_0000000c;
  undefined8 uVar2;
  undefined8 in_R9;
  ulong uVar3;
  
  uVar2 = CONCAT44(in_register_0000000c,argc);
  if (((((int)this_val.tag == -1) &&
       (in_RAX = (ulong)*(ushort *)((long)this_val.u.ptr + 6), in_RAX < 0x32)) &&
      (uVar2 = 0x2200000012000, (0x2200000012000U >> (in_RAX & 0x3f) & 1) != 0)) &&
     (((in_RAX = *(ulong *)((long)this_val.u.ptr + 0x30), in_RAX != 0 &&
       ((*(byte *)(in_RAX + 0x18) & 1) == 0)) && ((*(byte *)(in_RAX + 0x19) & 1) != 0)))) {
    uVar3 = 3;
  }
  else {
    JS_ThrowTypeError(ctx,"invalid property access",this_val.tag,uVar2,argv,in_R9,in_RAX);
    uVar3 = 6;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  return (JSValue)(auVar1 << 0x40);
}

Assistant:

static JSFunctionBytecode *JS_GetFunctionBytecode(JSValueConst val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return NULL;
    p = JS_VALUE_GET_OBJ(val);
    if (!js_class_has_bytecode(p->class_id))
        return NULL;
    return p->u.func.function_bytecode;
}